

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O0

vector<Interval,_std::allocator<Interval>_> *
getTracked(vector<Interval,_std::allocator<Interval>_> *__return_storage_ptr__,Database *database,
          Rules *rules,IntervalFilter *filter)

{
  bool bVar1;
  uint uVar2;
  string *psVar3;
  size_type args;
  iterator __first;
  iterator __last;
  allocator<char> local_281;
  string local_280;
  string local_260;
  undefined1 local_240 [8];
  Interval interval_1;
  Interval *interval;
  __normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_> local_170;
  iterator __end2;
  iterator __begin2;
  vector<Interval,_std::allocator<Interval>_> *__range2;
  Interval latest;
  iterator end;
  undefined1 local_50 [8];
  iterator it;
  int current_id;
  IntervalFilter *filter_local;
  Rules *rules_local;
  Database *database_local;
  vector<Interval,_std::allocator<Interval>_> *intervals;
  
  it.lines_end.current._M_current._4_4_ = 0;
  it.lines_end.current._M_current._3_1_ = 0;
  std::vector<Interval,_std::allocator<Interval>_>::vector(__return_storage_ptr__);
  Database::begin((iterator *)local_50,database);
  Database::end((iterator *)&latest._tags._M_t._M_impl.super__Rb_tree_header._M_node_count,database)
  ;
  bVar1 = Database::iterator::operator!=
                    ((iterator *)local_50,
                     (iterator *)&latest._tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (bVar1) {
    psVar3 = Database::iterator::operator*[abi_cxx11_((iterator *)local_50);
    IntervalFactory::fromSerialization((Interval *)&__range2,psVar3);
    Database::iterator::operator++((iterator *)local_50);
    expandLatest((vector<Interval,_std::allocator<Interval>_> *)&__begin2,(Interval *)&__range2,
                 rules);
    __end2 = std::vector<Interval,_std::allocator<Interval>_>::begin
                       ((vector<Interval,_std::allocator<Interval>_> *)&__begin2);
    local_170._M_current =
         (Interval *)
         std::vector<Interval,_std::allocator<Interval>_>::end
                   ((vector<Interval,_std::allocator<Interval>_> *)&__begin2);
    while (bVar1 = __gnu_cxx::operator!=(&__end2,&local_170), bVar1) {
      interval_1._tags._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)__gnu_cxx::
                   __normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>
                   ::operator*(&__end2);
      it.lines_end.current._M_current._4_4_ = it.lines_end.current._M_current._4_4_ + 1;
      uVar2 = (**filter->_vptr_IntervalFilter)
                        (filter,interval_1._tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if ((uVar2 & 1) == 0) {
        bVar1 = IntervalFilter::is_done(filter);
        if (bVar1) break;
      }
      else {
        *(int *)(interval_1._tags._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x68) =
             it.lines_end.current._M_current._4_4_;
        std::vector<Interval,_std::allocator<Interval>_>::push_back
                  (__return_storage_ptr__,
                   (value_type *)interval_1._tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      __gnu_cxx::__normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>::
      operator++(&__end2);
    }
    std::vector<Interval,_std::allocator<Interval>_>::~vector
              ((vector<Interval,_std::allocator<Interval>_> *)&__begin2);
    Interval::~Interval((Interval *)&__range2);
  }
  while (bVar1 = Database::iterator::operator!=
                           ((iterator *)local_50,
                            (iterator *)
                            &latest._tags._M_t._M_impl.super__Rb_tree_header._M_node_count), bVar1)
  {
    psVar3 = Database::iterator::operator*[abi_cxx11_((iterator *)local_50);
    IntervalFactory::fromSerialization((Interval *)local_240,psVar3);
    interval_1.super_Range.end._date._0_4_ = it.lines_end.current._M_current._4_4_ + 1;
    it.lines_end.current._M_current._4_4_ = (int)interval_1.super_Range.end._date;
    uVar2 = (**filter->_vptr_IntervalFilter)(filter,local_240);
    if ((uVar2 & 1) == 0) {
      bVar1 = IntervalFilter::is_done(filter);
      if (!bVar1) goto LAB_0019350f;
      bVar1 = true;
    }
    else {
      std::vector<Interval,_std::allocator<Interval>_>::push_back
                (__return_storage_ptr__,(value_type *)local_240);
LAB_0019350f:
      bVar1 = false;
    }
    Interval::~Interval((Interval *)local_240);
    if (bVar1) break;
    Database::iterator::operator++((iterator *)local_50);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"Loaded {1} tracked intervals",&local_281);
  args = std::vector<Interval,_std::allocator<Interval>_>::size(__return_storage_ptr__);
  format<unsigned_long>(&local_260,&local_280,args);
  debug(&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  __first = std::vector<Interval,_std::allocator<Interval>_>::begin(__return_storage_ptr__);
  __last = std::vector<Interval,_std::allocator<Interval>_>::end(__return_storage_ptr__);
  std::
  reverse<__gnu_cxx::__normal_iterator<Interval*,std::vector<Interval,std::allocator<Interval>>>>
            ((__normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>)
             __first._M_current,
             (__normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>)
             __last._M_current);
  return __return_storage_ptr__;
}

Assistant:

std::vector <Interval> getTracked (
  Database& database,
  const Rules& rules,
  IntervalFilter& filter)
{
  int current_id = 0;
  std::vector <Interval> intervals;

  auto it = database.begin ();
  auto end = database.end ();

  // Because the latest recorded interval may be expanded into synthetic
  // intervals, we'll handle it specially
  if (it != end )
  {
    Interval latest = IntervalFactory::fromSerialization (*it);
    ++it;

    for (auto& interval : expandLatest (latest, rules))
    {
      ++current_id;
      if (filter.accepts (interval))
      {
        interval.id = current_id;
        intervals.push_back (interval);
      }
      else if (filter.is_done ())
      {
        break;
      }
    }
  }

  for (; it != end; ++it)
  {
    Interval interval = IntervalFactory::fromSerialization (*it);
    interval.id = ++current_id;

    if (filter.accepts (interval))
    {
      intervals.push_back (std::move (interval));
    }
    else if (filter.is_done ())
    {
      // Since we are moving backwards in time, and the intervals are in sorted
      // order, if the filter is after the interval, we know there will be no
      // more matches
      break;
    }
  }

  debug (format ("Loaded {1} tracked intervals", intervals.size ()));

  // By default, intervals are sorted by id, but getTracked needs to return the
  // intervals sorted by date, which are ids in reverse order.
  std::reverse (intervals.begin (), intervals.end ());

  return intervals;
}